

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

err_t rngCreate(read_i source,void *source_state)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  rng_state_st *buf;
  ulong uVar4;
  long lVar5;
  size_t read;
  void *local_40;
  read_i local_38;
  
  bVar1 = mtCallOnce(&_once,rngInit);
  eVar2 = 0xc9;
  if ((bVar1 != 0) && ((_inited & 1) != 0)) {
    mtMtxLock(_mtx);
    if (_ctr == 0) {
      sVar3 = rngCreate_keep();
      _state = (rng_state_st *)blobCreate(sVar3);
      if (_state == (rng_state_st *)0x0) {
        mtMtxUnlock(_mtx);
        eVar2 = 0x6e;
      }
      else {
        local_40 = source_state;
        local_38 = source;
        beltHashStart(_state + 1);
        uVar4 = 0;
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
          eVar2 = rngESRead(&read,_state,0x20,
                            (char *)((long)&DAT_0013a358 +
                                    (long)*(int *)((long)&DAT_0013a358 + lVar5)));
          sVar3 = read;
          if (eVar2 == 0) {
            beltHashStepH(_state,read,_state + 1);
            uVar4 = uVar4 + sVar3;
          }
        }
        if (local_38 != (read_i)0x0) {
          eVar2 = (*local_38)(&read,_state,0x20,local_40);
          if (eVar2 == 0) {
            beltHashStepH(_state,read,_state + 1);
            uVar4 = uVar4 + read;
          }
        }
        if (uVar4 < 0x20) {
          blobClose(_state);
          _state = (rng_state_st *)0x0;
          mtMtxUnlock(_mtx);
          eVar2 = 0x12f;
        }
        else {
          beltHashStepG(_state->block,_state + 1);
          buf = _state + 1;
          eVar2 = 0;
          sVar3 = beltHash_keep();
          memWipe(buf,sVar3);
          brngCTRStart(_state + 1,_state->block,(octet *)0x0);
          memWipe(_state,0x20);
          _ctr = 1;
          mtMtxUnlock(_mtx);
        }
      }
    }
    else {
      if (source != (read_i)0x0) {
        eVar2 = (*source)(&read,_state,0x20,source_state);
        if (eVar2 == 0) {
          brngCTRStepR(_state,0x20,_state + 1);
        }
      }
      _ctr = _ctr + 1;
      mtMtxUnlock(_mtx);
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

err_t rngCreate(read_i source, void* source_state)
{
	const char* sources[] = { "trng", "trng2", "sys", "timer" };
	size_t read, count, pos;
	// инициализировать однократно
	if (!mtCallOnce(&_once, rngInit) || !_inited)
		return ERR_FILE_CREATE;
	// заблокировать мьютекс
	mtMtxLock(_mtx);
	// состояние уже создано?
	if (_ctr)
	{
		// учесть дополнительный источник
		if (source && source(&read, _state->block, 32, source_state) == ERR_OK)
			brngCTRStepR(_state->block, 32, _state->alg_state);
		// увеличить счетчик обращений и завершить
		++_ctr;
		mtMtxUnlock(_mtx);
		return ERR_OK;
	}
	// создать состояние
	_state = (rng_state_st*)blobCreate(rngCreate_keep());
	if (!_state)
	{
		mtMtxUnlock(_mtx);
		return ERR_OUTOFMEMORY;
	}
	// опрос источников случайности
	count = 0;
	beltHashStart(_state->alg_state);
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
		if (rngESRead(&read, _state->block, 32, sources[pos]) == ERR_OK)
		{
			beltHashStepH(_state->block, read, _state->alg_state);
			count += read;
		}
	if (source && source(&read, _state->block, 32, source_state) == ERR_OK)
	{
		beltHashStepH(_state->block, read, _state->alg_state);
		count += read;
	}
	if (count < 32)
	{
		blobClose(_state), _state = 0;
		mtMtxUnlock(_mtx);
		return ERR_NOT_ENOUGH_ENTROPY;
	}
	// создать brngCTR
	beltHashStepG(_state->block, _state->alg_state);
	memWipe(_state->alg_state, beltHash_keep());
	brngCTRStart(_state->alg_state, _state->block, 0);
	memWipe(_state->block, 32);
	// завершить
	_ctr = 1;
	mtMtxUnlock(_mtx);
	return ERR_OK;
}